

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

bool __thiscall sshash::map::update(map *this,string *hash,string *str,string *elf)

{
  ulong uVar1;
  bool bVar2;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  undefined4 local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  undefined1 local_a0 [8];
  string ex;
  undefined1 local_70 [8];
  string __he;
  string __hs;
  string *elf_local;
  string *str_local;
  string *hash_local;
  map *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&__he.field_2 + 8),hash,".str");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,hash,
                 ".elf");
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_d0,(undefined1 *)((long)&__he.field_2 + 8),0x2e);
  std::__cxx11::string::string((string *)&local_f8);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            ((type *)local_a0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)this,&local_d0,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_d0);
  uVar1 = std::__cxx11::string::empty();
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    boost::property_tree::
    string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::string_path(&local_130,(undefined1 *)((long)&__he.field_2 + 8),0x2e);
    boost::property_tree::
    basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
    put<std::__cxx11::string>
              ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                *)this,&local_130,str);
    boost::property_tree::
    string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~string_path(&local_130);
    boost::property_tree::
    string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::string_path(&local_168,local_70,0x2e);
    boost::property_tree::
    basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
    put<std::__cxx11::string>
              ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                *)this,&local_168,elf);
    boost::property_tree::
    string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~string_path(&local_168);
  }
  local_fc = 1;
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(__he.field_2._M_local_buf + 8));
  return bVar2;
}

Assistant:

bool map::update(const std::string& hash, const std::string& str, const std::string& elf)
{
	std::string __hs = hash + ".str";
	std::string __he = hash + ".elf";

	std::string ex = this->get<std::string>(__hs, std::string());
	if (!ex.empty())
		return false;

	this->put(__hs, str);
	this->put(__he, elf);

	return true;
}